

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_info.hpp
# Opt level: O1

value * lightconf::value_type_info<std::vector<int,_std::allocator<int>_>_>::create_value
                  (value *__return_storage_ptr__,vector<int,_std::allocator<int>_> *x)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Base_ptr p_Var3;
  int *piVar4;
  value *pvVar5;
  int *piVar6;
  value_vector_type inner_vals;
  vector<lightconf::value,_std::allocator<lightconf::value>_> local_e8;
  value *local_d0;
  value local_c8;
  
  local_e8.super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar6 = (x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  local_d0 = __return_storage_ptr__;
  if (piVar6 != piVar4) {
    paVar2 = &local_c8.string_value_.field_2;
    p_Var3 = &local_c8.group_value_.values_._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      local_c8.number_value_ = (double)*piVar6;
      local_c8.type_ = number_type;
      local_c8.string_value_._M_string_length = 0;
      local_c8.string_value_.field_2._M_local_buf[0] = '\0';
      local_c8.group_value_.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_c8.group_value_.values_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      local_c8.group_value_.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_c8.vector_value_.super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c8.group_value_.values_._M_t._M_impl._0_8_ = 0;
      local_c8.vector_value_.super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.vector_value_.super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.group_value_.order_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.group_value_.order_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c8.group_value_.values_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_c8.group_value_.order_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.string_value_._M_dataplus._M_p = (pointer)paVar2;
      local_c8.group_value_.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var3;
      local_c8.group_value_.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var3;
      std::vector<lightconf::value,_std::allocator<lightconf::value>_>::
      emplace_back<lightconf::value>(&local_e8,&local_c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8.group_value_.order_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
                   *)&local_c8.group_value_);
      std::vector<lightconf::value,_std::allocator<lightconf::value>_>::~vector
                (&local_c8.vector_value_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.string_value_._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8.string_value_._M_dataplus._M_p);
      }
      piVar6 = piVar6 + 1;
    } while (piVar6 != piVar4);
  }
  pvVar5 = local_d0;
  local_d0->type_ = vector_type;
  (local_d0->string_value_)._M_dataplus._M_p = (pointer)&(local_d0->string_value_).field_2;
  (local_d0->string_value_)._M_string_length = 0;
  (local_d0->string_value_).field_2._M_local_buf[0] = '\0';
  std::vector<lightconf::value,_std::allocator<lightconf::value>_>::vector
            (&local_d0->vector_value_,&local_e8);
  p_Var1 = &(pvVar5->group_value_).values_._M_t._M_impl.super__Rb_tree_header;
  (pvVar5->group_value_).values_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (pvVar5->group_value_).values_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  (pvVar5->group_value_).values_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  (pvVar5->group_value_).values_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(pvVar5->group_value_).values_._M_t._M_impl = 0;
  *(undefined8 *)&(pvVar5->group_value_).values_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (pvVar5->group_value_).values_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (pvVar5->group_value_).values_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (pvVar5->group_value_).order_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar5->group_value_).order_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pvVar5->group_value_).values_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pvVar5->group_value_).order_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<lightconf::value,_std::allocator<lightconf::value>_>::~vector(&local_e8);
  return pvVar5;
}

Assistant:

static value create_value(const std::vector<U>& x) {
        value_vector_type inner_vals;
        for (const auto& u : x) {
            inner_vals.push_back(value_type_info<U>::create_value(u));
        }
        return value(inner_vals);
    }